

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomign(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int *in_RCX;
  ull *in_RDX;
  ull *in_RSI;
  long in_RDI;
  int *n;
  int in_stack_00000084;
  matches *local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    bf_(*in_RCX,in_RCX[1],in_RSI,in_RDX);
    local_8 = (matches *)0x0;
  }
  else {
    local_8 = alwaysmatches(in_stack_00000084);
  }
  return local_8;
}

Assistant:

struct matches *atomign APROTO {
	if (ctx->reverse)
		return alwaysmatches(spos);
	const int *n = v;
	(void)BF(n[0], n[1]);
	return NULL;
}